

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_synth.cpp
# Opt level: O3

VkPipeline
synthesize_graphics_pipeline
          (StateRecorder *recorder,vector<unsigned_char,_std::allocator<unsigned_char>_> *modules,
          spvc_compiler *compilers,VkPipelineLayout layout,VkRenderPass render_pass,
          uint8_t active_rt_mask,SpecConstant *specs)

{
  VkShaderModule module;
  undefined4 uVar1;
  VkPipelineVertexInputStateCreateInfo *pVVar2;
  VkPipelineVertexInputStateCreateInfo *pVVar3;
  spvc_compiler compiler;
  bool bVar4;
  spvc_result sVar5;
  uint uVar6;
  uint uVar7;
  spvc_basetype sVar8;
  uint uVar9;
  spvc_type type;
  VkVertexInputAttributeDescription *pVVar10;
  undefined4 *puVar11;
  long lVar12;
  pointer pVVar13;
  pointer pVVar14;
  VkPipeline pVVar15;
  ulong uVar16;
  vector<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
  attributes;
  vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_> stages;
  size_t size;
  spvc_reflected_resource *list;
  VkVertexInputBindingDescription vertex_binding;
  VkPipelineInputAssemblyStateCreateInfo ia;
  VkSampleMask sample_mask;
  VkPipelineColorBlendStateCreateInfo blend;
  VkPipelineVertexInputStateCreateInfo vi;
  VkGraphicsPipelineCreateInfo info;
  VkRect2D sci;
  VkPipelineColorBlendAttachmentState attachments [8];
  VkPipelineTessellationStateCreateInfo tess;
  VkViewport viewport;
  VkPipelineDynamicStateCreateInfo dyn;
  VkPipelineMultisampleStateCreateInfo ms;
  vector<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
  local_408;
  vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
  local_3e8;
  spvc_compiler *local_3d0;
  ulong local_3c8;
  spvc_reflected_resource *local_3c0;
  VkVertexInputBindingDescription local_3b8;
  VkPipelineInputAssemblyStateCreateInfo local_3a8;
  VkPipelineLayout local_380;
  VkRenderPass local_378;
  VkSampleMask local_36c;
  VkPipelineColorBlendStateCreateInfo local_368;
  VkPipelineRasterizationStateCreateInfo local_328;
  VkPipelineVertexInputStateCreateInfo local_2e8;
  VkSpecializationInfo local_2b8;
  VkGraphicsPipelineCreateInfo local_298;
  VkRect2D local_208;
  VkPipelineShaderStageCreateInfo local_1f8 [5];
  VkPipelineTessellationStateCreateInfo local_f8;
  VkViewport local_d8;
  VkPipelineDynamicStateCreateInfo local_b8;
  VkPipelineMultisampleStateCreateInfo local_98;
  VkPipelineViewportStateCreateInfo local_68;
  
  local_3e8.
  super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3e8.
  super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (VkPipelineShaderStageCreateInfo *)0x0;
  lVar12 = 0;
  local_3e8.
  super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (VkPipelineShaderStageCreateInfo *)0x0;
  local_3d0 = compilers;
  local_380 = layout;
  local_378 = render_pass;
  std::vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>::
  reserve(&local_3e8,7);
  local_2b8.pData =
       (specs->data).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_2b8.dataSize =
       (long)(specs->data).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish - (long)local_2b8.pData;
  local_2b8.pMapEntries =
       (specs->map_entries).
       super__Vector_base<VkSpecializationMapEntry,_std::allocator<VkSpecializationMapEntry>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_2b8._0_8_ =
       (ulong)((long)(specs->map_entries).
                     super__Vector_base<VkSpecializationMapEntry,_std::allocator<VkSpecializationMapEntry>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)local_2b8.pMapEntries) >> 4
       & 0xffffffff;
  do {
    pVVar2 = (VkPipelineVertexInputStateCreateInfo *)
             modules[lVar12].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pVVar3 = (VkPipelineVertexInputStateCreateInfo *)
             modules[lVar12].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pVVar2 != pVVar3) {
      local_298.pNext = (void *)0x0;
      local_298.flags = 0;
      local_298.stageCount = 0;
      local_298.sType = VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO;
      local_298._4_4_ = 0;
      local_298.pStages = (VkPipelineShaderStageCreateInfo *)((long)pVVar3 - (long)pVVar2);
      module = (VkShaderModule)(lVar12 + 1);
      local_298.pVertexInputState = pVVar2;
      bVar4 = Fossilize::StateRecorder::record_shader_module
                        (recorder,module,(VkShaderModuleCreateInfo *)&local_298,0);
      if (!bVar4) {
        pVVar15 = (VkPipeline)0x0;
        goto LAB_0011a669;
      }
      local_1f8[0].pNext = (void *)0x0;
      local_1f8[0].pSpecializationInfo = (VkSpecializationInfo *)0x0;
      local_1f8[0].sType = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
      local_1f8[0]._4_4_ = 0;
      local_1f8[0].pName = "main";
      local_1f8[0]._16_8_ = (ulong)to_vk_shader_stage[lVar12] << 0x20;
      if (local_2b8.dataSize != 0) {
        local_1f8[0].pSpecializationInfo = &local_2b8;
      }
      local_1f8[0].module = module;
      if (local_3e8.
          super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_3e8.
          super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<VkPipelineShaderStageCreateInfo,std::allocator<VkPipelineShaderStageCreateInfo>>
        ::_M_realloc_insert<VkPipelineShaderStageCreateInfo_const&>
                  ((vector<VkPipelineShaderStageCreateInfo,std::allocator<VkPipelineShaderStageCreateInfo>>
                    *)&local_3e8,
                   (iterator)
                   local_3e8.
                   super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish,local_1f8);
      }
      else {
        (local_3e8.
         super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
         ._M_impl.super__Vector_impl_data._M_finish)->pName = "main";
        (local_3e8.
         super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
         ._M_impl.super__Vector_impl_data._M_finish)->pSpecializationInfo =
             local_1f8[0].pSpecializationInfo;
        (local_3e8.
         super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
         ._M_impl.super__Vector_impl_data._M_finish)->flags = local_1f8[0].flags;
        (local_3e8.
         super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
         ._M_impl.super__Vector_impl_data._M_finish)->stage = local_1f8[0].stage;
        (local_3e8.
         super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
         ._M_impl.super__Vector_impl_data._M_finish)->module = module;
        (local_3e8.
         super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
         ._M_impl.super__Vector_impl_data._M_finish)->sType =
             VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
        *(undefined4 *)
         &(local_3e8.
           super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish)->field_0x4 = 0;
        *(undefined4 *)
         &(local_3e8.
           super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish)->pNext = 0;
        *(undefined4 *)
         ((long)&(local_3e8.
                  super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->pNext + 4) = 0;
        local_3e8.
        super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_3e8.
             super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 7);
  lVar12 = 0;
  memset(&local_298,0,0x90);
  local_298.sType = VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO;
  local_68.pScissors = &local_208;
  local_208.offset.x = 0;
  local_208.offset.y = 0;
  local_208.extent.width = 0x400;
  local_208.extent.height = 0x400;
  local_68.pViewports = &local_d8;
  local_d8.x = 0.0;
  local_d8.y = 0.0;
  local_d8.width = 1024.0;
  local_d8.height = 1024.0;
  local_d8.minDepth = 0.0;
  local_d8.maxDepth = 1.0;
  local_298.pViewportState = &local_68;
  local_68.pNext = (void *)0x0;
  local_68.sType = VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO;
  local_68._4_4_ = 0;
  local_68.scissorCount = 1;
  local_68._36_4_ = 0;
  local_68.flags = 0;
  local_68.viewportCount = 1;
  local_298.pMultisampleState = &local_98;
  local_98.pNext = (void *)0x0;
  local_98.alphaToCoverageEnable = 0;
  local_98.alphaToOneEnable = 0;
  local_98.sampleShadingEnable = 0;
  local_98.minSampleShading = 0.0;
  local_98.sType = VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO;
  local_98._4_4_ = 0;
  local_98.pSampleMask = &local_36c;
  local_36c = 0xffffffff;
  local_98.flags = 0;
  local_98.rasterizationSamples = VK_SAMPLE_COUNT_1_BIT;
  local_298.pTessellationState = &local_f8;
  local_f8.sType = VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_STATE_CREATE_INFO;
  local_f8._4_4_ = 0;
  local_f8.pNext = (void *)0x0;
  local_f8.flags = 0;
  local_f8.patchControlPoints = 1;
  local_298.pDynamicState = &local_b8;
  local_b8.flags = 0;
  local_b8.dynamicStateCount = 0;
  local_b8.pDynamicStates = (VkDynamicState *)0x0;
  local_b8.sType = VK_STRUCTURE_TYPE_PIPELINE_DYNAMIC_STATE_CREATE_INFO;
  local_b8._4_4_ = 0;
  local_b8.pNext = (void *)0x0;
  local_368.pNext = (void *)0x0;
  local_368.blendConstants[2] = 0.0;
  local_368.blendConstants[3] = 0.0;
  local_368.pAttachments = (VkPipelineColorBlendAttachmentState *)0x0;
  local_368.blendConstants[0] = 0.0;
  local_368.blendConstants[1] = 0.0;
  local_368.flags = 0;
  local_368.logicOpEnable = 0;
  local_368.logicOp = VK_LOGIC_OP_CLEAR;
  local_368.attachmentCount = 0;
  local_368.sType = VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO;
  local_368._4_4_ = 0;
  memset(local_1f8,0,0x100);
  puVar11 = (undefined4 *)((long)&local_1f8[0].module + 4);
  do {
    if ((active_rt_mask >> ((uint)lVar12 & 0x1f) & 1) != 0) {
      local_368.attachmentCount = (uint)lVar12 + 1;
      *puVar11 = 0xf;
    }
    lVar12 = lVar12 + 1;
    puVar11 = puVar11 + 8;
  } while (lVar12 != 8);
  local_298.pColorBlendState = &local_368;
  local_408.
  super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (VkVertexInputAttributeDescription *)0x0;
  local_408.
  super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_408.
  super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
  ._M_impl.super__Vector_impl_data._M_finish = (VkVertexInputAttributeDescription *)0x0;
  local_3b8.binding = 0;
  local_3b8.stride = 0;
  local_3b8.inputRate = VK_VERTEX_INPUT_RATE_VERTEX;
  local_2e8.pNext = (void *)0x0;
  local_2e8.vertexAttributeDescriptionCount = 0;
  local_2e8._36_4_ = 0;
  local_2e8.pVertexAttributeDescriptions = (pointer)0x0;
  local_2e8.flags = 0;
  local_2e8.vertexBindingDescriptionCount = 0;
  local_2e8.pVertexBindingDescriptions = (VkVertexInputBindingDescription *)0x0;
  local_2e8.sType = VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO;
  local_2e8._4_4_ = 0;
  compiler = *local_3d0;
  local_368.pAttachments = (VkPipelineColorBlendAttachmentState *)local_1f8;
  if (compiler == (spvc_compiler)0x0) {
    local_3a8.flags = 0;
    local_3a8.topology = VK_PRIMITIVE_TOPOLOGY_POINT_LIST;
  }
  else {
    sVar5 = spvc_compiler_create_shader_resources(compiler,(spvc_resources *)&local_3a8);
    if ((sVar5 != SPVC_SUCCESS) ||
       (sVar5 = spvc_resources_get_resource_list_for_type
                          ((spvc_resources)local_3a8._0_8_,SPVC_RESOURCE_TYPE_STAGE_INPUT,&local_3c0
                           ,&local_3c8), sVar5 != SPVC_SUCCESS)) {
LAB_0011a52b:
      pVVar15 = (VkPipeline)0x0;
      goto LAB_0011a652;
    }
    pVVar13 = (pointer)0x0;
    if (local_3c8 == 0) {
      pVVar10 = (VkVertexInputAttributeDescription *)0x0;
      pVVar14 = pVVar13;
    }
    else {
      uVar16 = 0;
      do {
        uVar6 = spvc_compiler_get_decoration(compiler,local_3c0[uVar16].id,SpvDecorationLocation);
        type = spvc_compiler_get_type_handle(compiler,local_3c0[uVar16].type_id);
        uVar7 = spvc_type_get_columns(type);
        sVar8 = spvc_type_get_basetype(type);
        uVar9 = sVar8 - SPVC_BASETYPE_INT16;
        if ((8 < uVar9) || ((399U >> (uVar9 & 0x1f) & 1) == 0)) {
          synthesize_graphics_pipeline();
          goto LAB_0011a52b;
        }
        if (uVar7 != 0) {
          uVar1 = *(undefined4 *)(&DAT_002e26b4 + (ulong)uVar9 * 4);
          do {
            local_328._4_4_ = 0;
            local_328.sType = uVar6;
            local_328.pNext = (void *)CONCAT44((int)pVVar13,uVar1);
            if (local_408.
                super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                local_408.
                super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
              ::_M_realloc_insert<VkVertexInputAttributeDescription>
                        (&local_408,
                         (iterator)
                         local_408.
                         super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
                         ._M_impl.super__Vector_impl_data._M_finish,
                         (VkVertexInputAttributeDescription *)&local_328);
            }
            else {
              (local_408.
               super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
               ._M_impl.super__Vector_impl_data._M_finish)->location = uVar6;
              (local_408.
               super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
               ._M_impl.super__Vector_impl_data._M_finish)->binding = 0;
              *(void **)&(local_408.
                          super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
                          ._M_impl.super__Vector_impl_data._M_finish)->format = local_328.pNext;
              local_408.
              super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_408.
                   super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
            }
            uVar9 = (int)pVVar13 + 0x10;
            pVVar13 = (pointer)(ulong)uVar9;
            local_3b8.stride = uVar9;
            uVar6 = uVar6 + 1;
            uVar7 = uVar7 - 1;
          } while (uVar7 != 0);
        }
        uVar16 = uVar16 + 1;
        pVVar10 = local_408.
                  super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pVVar14 = local_408.
                  super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar16 < local_3c8);
    }
    local_298.pVertexInputState = &local_2e8;
    local_2e8.vertexBindingDescriptionCount = 1;
    local_2e8.pVertexBindingDescriptions = &local_3b8;
    local_2e8.vertexAttributeDescriptionCount =
         (uint32_t)((ulong)((long)pVVar10 - (long)pVVar14) >> 4);
    local_3a8.flags = 0;
    local_3a8.topology = VK_PRIMITIVE_TOPOLOGY_POINT_LIST;
    local_2e8.pVertexAttributeDescriptions = pVVar14;
    if (*local_3d0 != (spvc_compiler)0x0) {
      local_3a8.flags = 0;
      local_3a8.topology = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
      local_298.pInputAssemblyState = &local_3a8;
    }
  }
  local_3a8.primitiveRestartEnable = 0;
  local_3a8._28_4_ = 0;
  local_3a8.pNext = (void *)0x0;
  local_3a8._0_8_ = (spvc_resources)0x14;
  local_298.pRasterizationState = &local_328;
  local_328.pNext = (void *)0x0;
  local_328.depthBiasEnable = 0;
  local_328.depthBiasConstantFactor = 0.0;
  local_328.depthBiasClamp = 0.0;
  local_328.depthBiasSlopeFactor = 0.0;
  local_328.lineWidth = 0.0;
  local_328._60_4_ = 0;
  local_328.flags = 0;
  local_328.depthClampEnable = 0;
  local_328.rasterizerDiscardEnable = 0;
  local_328.polygonMode = VK_POLYGON_MODE_FILL;
  local_328._0_8_ = 0x17;
  local_328.cullMode = 0;
  local_328.frontFace = VK_FRONT_FACE_COUNTER_CLOCKWISE;
  local_298.stageCount =
       (int)((ulong)((long)local_3e8.
                           super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_3e8.
                          super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555;
  local_298.pStages =
       local_3e8.
       super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_298.layout = local_380;
  local_298.renderPass = local_378;
  pVVar15 = (VkPipeline)0x0;
  bVar4 = Fossilize::StateRecorder::record_graphics_pipeline
                    (recorder,(VkPipeline)&DAT_00000001,&local_298,(VkPipeline *)0x0,0,0,
                     (VkDevice)0x0,(PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
  if (bVar4) {
    if (((specs->iteration).count != 0) &&
       ((ulong)(specs->iteration).index <
        (ulong)((long)(specs->data).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(specs->data).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 2))) {
      pVVar15 = (VkPipeline)0x0;
      uVar16 = 0;
      do {
        (specs->data).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[(specs->iteration).index] = (uint)uVar16;
        bVar4 = Fossilize::StateRecorder::record_graphics_pipeline
                          (recorder,(VkPipeline)(ulong)((uint)uVar16 + 2),&local_298,
                           (VkPipeline *)0x0,0,0,(VkDevice)0x0,
                           (PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
        if (!bVar4) goto LAB_0011a652;
        uVar16 = uVar16 + 1;
      } while (uVar16 < (specs->iteration).count);
    }
    pVVar15 = (VkPipeline)&DAT_00000001;
  }
LAB_0011a652:
  if (local_408.
      super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_408.
                    super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_408.
                          super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_408.
                          super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
LAB_0011a669:
  if (local_3e8.
      super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3e8.
                    super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_3e8.
                          super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3e8.
                          super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pVVar15;
}

Assistant:

static VkPipeline synthesize_graphics_pipeline(StateRecorder &recorder,
                                               const std::vector<uint8_t> *modules,
                                               spvc_compiler *compilers,
                                               VkPipelineLayout layout,
                                               VkRenderPass render_pass,
                                               uint8_t active_rt_mask,
                                               SpecConstant &specs)
{
	std::vector<VkPipelineShaderStageCreateInfo> stages;
	stages.reserve(STAGE_COUNT - 1);

	VkSpecializationInfo spec_info = {};

	spec_info.dataSize = specs.data.size() * sizeof(uint32_t);
	spec_info.pData = specs.data.data();
	spec_info.mapEntryCount = specs.map_entries.size();
	spec_info.pMapEntries = specs.map_entries.data();

	for (unsigned i = 0; i <= STAGE_FRAG; i++)
	{
		if (!modules[i].empty())
		{
			VkShaderModuleCreateInfo module_info = { VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO };
			module_info.codeSize = modules[i].size();
			module_info.pCode = reinterpret_cast<const uint32_t *>(modules[i].data());
			if (!recorder.record_shader_module((VkShaderModule)uint64_t(1 + i), module_info))
				return VK_NULL_HANDLE;

			VkPipelineShaderStageCreateInfo stage = { VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO };
			stage.module = (VkShaderModule)uint64_t(1 + i);
			stage.pName = "main";
			stage.stage = to_vk_shader_stage[i];
			if (spec_info.dataSize != 0)
				stage.pSpecializationInfo = &spec_info;
			stages.push_back(stage);
		}
	}

	VkGraphicsPipelineCreateInfo info = { VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO };
	const VkRect2D sci = {{0, 0}, {1024, 1024}};
	const VkViewport viewport = {0, 0, 1024, 1024, 0, 1};
	VkPipelineViewportStateCreateInfo vp = { VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO };
	{
		vp.scissorCount = 1;
		vp.viewportCount = 1;
		vp.pScissors = &sci;
		vp.pViewports = &viewport;
		info.pViewportState = &vp;
	}

	VkPipelineMultisampleStateCreateInfo ms = { VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO };
	const VkSampleMask sample_mask = 0xffffffffu;
	{
		ms.pSampleMask = &sample_mask;
		ms.rasterizationSamples = VK_SAMPLE_COUNT_1_BIT;
		info.pMultisampleState = &ms;
	}

	VkPipelineTessellationStateCreateInfo tess = { VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_STATE_CREATE_INFO };
	{
		tess.patchControlPoints = 1;
		info.pTessellationState = &tess;
	}

	VkPipelineDynamicStateCreateInfo dyn = { VK_STRUCTURE_TYPE_PIPELINE_DYNAMIC_STATE_CREATE_INFO };
	{
		info.pDynamicState = &dyn;
	}

	VkPipelineColorBlendStateCreateInfo blend = { VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO };
	VkPipelineColorBlendAttachmentState attachments[8] = {};
	{
		for (unsigned i = 0; i < 8; i++)
		{
			if (active_rt_mask & (1u << i))
			{
				blend.attachmentCount = i + 1;
				attachments[i].colorWriteMask = 0xf;
			}
		}
		blend.pAttachments = attachments;
		info.pColorBlendState = &blend;
	}

	std::vector<VkVertexInputAttributeDescription> attributes;
	VkVertexInputBindingDescription vertex_binding = {};

	VkPipelineVertexInputStateCreateInfo vi = { VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO };
	if (compilers[STAGE_VERT])
	{
		if (!append_attributes(compilers[STAGE_VERT], attributes, vertex_binding.stride))
			return VK_NULL_HANDLE;

		vi.vertexBindingDescriptionCount = 1;
		vi.pVertexBindingDescriptions = &vertex_binding;
		vi.vertexAttributeDescriptionCount = uint32_t(attributes.size());
		vi.pVertexAttributeDescriptions = attributes.data();
		info.pVertexInputState = &vi;
	}

	VkPipelineInputAssemblyStateCreateInfo ia = { VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO };
	if (compilers[STAGE_VERT])
	{
		ia.topology = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
		info.pInputAssemblyState = &ia;
	}

	VkPipelineRasterizationStateCreateInfo ras = { VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO };
	{
		ras.cullMode = VK_CULL_MODE_NONE;
		ras.frontFace = VK_FRONT_FACE_COUNTER_CLOCKWISE;
		ras.polygonMode = VK_POLYGON_MODE_FILL;
		info.pRasterizationState = &ras;
	}

	info.stageCount = uint32_t(stages.size());
	info.pStages = stages.data();
	info.layout = layout;
	info.renderPass = render_pass;

	if (!recorder.record_graphics_pipeline((VkPipeline)uint64_t(1), info, nullptr, 0))
		return VK_NULL_HANDLE;

	if (specs.iteration.count && specs.iteration.index < specs.data.size())
	{
		for (uint32_t i = 0; i < specs.iteration.count; i++)
		{
			specs.data[specs.iteration.index] = i;
			if (!recorder.record_graphics_pipeline((VkPipeline) uint64_t(2 + i), info, nullptr, 0))
				return VK_NULL_HANDLE;
		}
	}

	return (VkPipeline)uint64_t(1);
}